

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void Am_Abort_Interactor(Am_Object *inter,bool update_now)

{
  Am_Inter_State AVar1;
  Am_Value *pAVar2;
  Am_Object local_70;
  Am_Inter_Internal_Method method;
  Am_Input_Event local_50;
  
  Am_Object::Am_Object(&local_70,inter);
  AVar1 = Am_Get_Inter_State(&local_70);
  Am_Object::~Am_Object(&local_70);
  if (AVar1 == Am_INTER_WAITING) {
    Am_Object::Set(inter,0x123,3,1);
  }
  else {
    Am_Input_Char::Am_Input_Char
              (&local_50.input_char,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    local_50.user_id.type = 0;
    local_50.user_id.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar2 = Am_Object::Get(inter,0xbc,0);
    Am_Input_Char::operator=(&local_50.input_char,pAVar2);
    local_50.draw = (Am_Drawonable *)0x0;
    local_50.x = 0;
    local_50.y = 0;
    local_50.time_stamp = 0;
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar2 = Am_Object::Get(inter,0xc4,0);
    Am_Inter_Internal_Method::operator=(&method,pAVar2);
    (*method.Call)(inter,&Am_No_Object,&Am_No_Object,&local_50);
    if (update_now) {
      Am_Demon_Queue::Invoke(&Main_Demon_Queue);
      Am_Update_All();
    }
    Am_Value::~Am_Value(&local_50.user_id);
  }
  return;
}

Assistant:

void
Am_Abort_Interactor(Am_Object inter, bool update_now)
{
  Am_Inter_State state = Am_Get_Inter_State(inter);

  if (state == Am_INTER_WAITING || state == Am_INTER_ABORTING) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT,
                         "Explicitly Aborting " << inter << " but not running");
    inter.Set(Am_CURRENT_STATE, (int)Am_INTER_ABORTING, Am_OK_IF_NOT_THERE);
    return;
  }
  // else is running, abort the interactor

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Aborting " << inter);
  Am_Input_Event ev;
  ev.input_char = inter.Get(Am_ABORT_WHEN);
  ev.x = 0;
  ev.y = 0;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_ABORT_METHOD);
  method.Call(inter, Am_No_Object, Am_No_Object, &ev);
  if (update_now)
    do_update();
}